

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O3

void __thiscall
RTree::get_Range_Search_JSON
          (RTree *this,vector<Polygon_*,_std::allocator<Polygon_*>_> *data,string *json)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  string __str;
  vector<Point,_std::allocator<Point>_> dat;
  string __str_2;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<Point,_std::allocator<Point>_> local_78;
  long *local_60 [2];
  long local_50 [2];
  vector<Polygon_*,_std::allocator<Polygon_*>_> *local_40;
  ulong local_38;
  
  std::__cxx11::string::append((char *)json);
  if ((data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    local_40 = data;
    do {
      std::__cxx11::string::append((char *)json);
      std::__cxx11::string::append((char *)json);
      std::__cxx11::string::append((char *)json);
      Polygon::get_vertices
                (&local_78,
                 (data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar7]);
      if (local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
          ._M_finish !=
          local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
          ._M_start) {
        uVar10 = 0;
        local_38 = uVar7;
        do {
          std::__cxx11::string::append((char *)json);
          uVar1 = local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10].X;
          uVar2 = -uVar1;
          if (0 < (int)uVar1) {
            uVar2 = uVar1;
          }
          uVar9 = 1;
          if (9 < uVar2) {
            uVar7 = (ulong)uVar2;
            uVar3 = 4;
            do {
              uVar9 = uVar3;
              uVar4 = (uint)uVar7;
              if (uVar4 < 100) {
                uVar9 = uVar9 - 2;
                goto LAB_00107584;
              }
              if (uVar4 < 1000) {
                uVar9 = uVar9 - 1;
                goto LAB_00107584;
              }
              if (uVar4 < 10000) goto LAB_00107584;
              uVar7 = uVar7 / 10000;
              uVar3 = uVar9 + 4;
            } while (99999 < uVar4);
            uVar9 = uVar9 + 1;
          }
LAB_00107584:
          local_98 = &local_88;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_98,(char)uVar9 - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_98),uVar9,uVar2);
          std::__cxx11::string::_M_append((char *)json,(ulong)local_98);
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          std::__cxx11::string::append((char *)json);
          uVar1 = local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10].Y;
          uVar2 = -uVar1;
          if (0 < (int)uVar1) {
            uVar2 = uVar1;
          }
          uVar9 = 1;
          if (9 < uVar2) {
            uVar7 = (ulong)uVar2;
            uVar3 = 4;
            do {
              uVar9 = uVar3;
              uVar4 = (uint)uVar7;
              if (uVar4 < 100) {
                uVar9 = uVar9 - 2;
                goto LAB_00107645;
              }
              if (uVar4 < 1000) {
                uVar9 = uVar9 - 1;
                goto LAB_00107645;
              }
              if (uVar4 < 10000) goto LAB_00107645;
              uVar7 = uVar7 / 10000;
              uVar3 = uVar9 + 4;
            } while (99999 < uVar4);
            uVar9 = uVar9 + 1;
          }
LAB_00107645:
          local_98 = &local_88;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_98,(char)uVar9 - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_98),uVar9,uVar2);
          std::__cxx11::string::_M_append((char *)json,(ulong)local_98);
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          std::__cxx11::string::append((char *)json);
          uVar7 = local_38;
          data = local_40;
          uVar10 = uVar10 + 1;
          uVar5 = (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          if (uVar5 != uVar10) {
            std::__cxx11::string::append((char *)json);
            uVar5 = (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3;
          }
        } while (uVar10 < uVar5);
      }
      std::__cxx11::string::append((char *)json);
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct((ulong)local_60,'\x01');
      *(undefined1 *)local_60[0] = 0x30;
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x1092b2);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_88 = *plVar8;
        lStack_80 = plVar6[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar8;
        local_98 = (long *)*plVar6;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)json,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      std::__cxx11::string::append((char *)json);
      std::__cxx11::string::append((char *)json);
      uVar7 = uVar7 + 1;
      if ((long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != uVar7) {
        std::__cxx11::string::append((char *)json);
      }
      if (local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    } while (uVar7 < (ulong)((long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(data->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__cxx11::string::append((char *)json);
  return;
}

Assistant:

void RTree::get_Range_Search_JSON(const std::vector<Polygon *> & data, std::string &json){
    json += "[";
    for(int i=0; i<data.size(); i++){
        json +="[";
        json +="{";
        json +="\"elements\":[";    
        auto dat = data[i]->get_vertices();
        for(int j = 0; j < dat.size(); j++){
            json +="[";  
            
            json += std::to_string(dat[j].get_X());
            json += ",";
            json += std::to_string(dat[j].get_Y()); 
        
            json +="]";
            if((j+1) != dat.size())
                    json +=",";
        }            
    
        json +="],";
        json+="\"level\":"+std::to_string(0);
        json += "}";

        json +="]";
        if((i+1) != data.size())
            json +=",\n";
    }
    json += "]";
}